

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::LipidHeadVisitor::~LipidHeadVisitor(LipidHeadVisitor *this)

{
  LipidHeadVisitor *in_RDI;
  
  ~LipidHeadVisitor(in_RDI);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

LipidHeadVisitor(SimInfo* info) : BaseRigidBodyVisitor(info) {
      visitorName = "LipidHeadVisitor";
    }